

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::inverseDynamicsWithInternalJointForceTorques
          (KinDynComputations *this,Span<const_double,__1L> baseAcc,Span<const_double,__1L> s_ddot,
          LinkNetExternalWrenches *linkExtForces,
          FreeFloatingGeneralizedTorques *baseForceAndJointTorques,
          LinkInternalWrenches *linkInternalWrenches)

{
  Span<const_double,__1L> vec;
  index_type iVar1;
  long lVar2;
  undefined8 in_RCX;
  LinkInternalWrenches *in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  LinkNetExternalWrenches *unaff_retaddr;
  VectorDynSize *in_stack_00000008;
  Vector6 *in_stack_00000010;
  KinDynComputations *in_stack_00000018;
  bool ok;
  int expected_spatial_acceleration_size;
  undefined8 in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  VectorDynSize local_a8 [32];
  undefined8 local_88;
  VectorFixSize<6U> local_70;
  undefined1 local_3d;
  undefined4 local_3c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar3;
  
  local_3c = 6;
  local_28 = in_RCX;
  uStack_20 = in_R8;
  local_18 = in_RSI;
  iVar1 = Span<const_double,_-1L>::size((Span<const_double,__1L> *)0x1d0e2c);
  local_3d = iVar1 == 6;
  if ((bool)local_3d) {
    iVar1 = Span<const_double,_-1L>::size((Span<const_double,__1L> *)0x1d0e7a);
    lVar2 = iDynTree::Model::getNrOfDOFs();
    local_3d = iVar1 == lVar2;
    if ((bool)local_3d) {
      local_88 = local_18;
      vec.storage_.data_._0_7_ = in_stack_ffffffffffffff20;
      vec.storage_.super_extent_type<_1L>.size_ = in_stack_ffffffffffffff18;
      vec.storage_.data_._7_1_ = in_stack_ffffffffffffff27;
      VectorFixSize<6U>::VectorFixSize(&local_70,vec);
      iDynTree::VectorDynSize::VectorDynSize(local_a8,local_28,uStack_20);
      bVar3 = inverseDynamicsWithInternalJointForceTorques
                        (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                         (FreeFloatingGeneralizedTorques *)
                         CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDX);
      iDynTree::VectorDynSize::~VectorDynSize(local_a8);
    }
    else {
      iDynTree::reportError
                ("KinDynComputations","inverseDynamicsWithInternalJointForceTorques",
                 "Wrong size in input s_ddot");
      bVar3 = 0;
    }
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","inverseDynamicsWithInternalJointForceTorques",
               "Wrong size in input baseAcc");
    bVar3 = 0;
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool KinDynComputations::inverseDynamicsWithInternalJointForceTorques(iDynTree::Span<const double> baseAcc,
                                                                      iDynTree::Span<const double> s_ddot,
                                                                      const LinkNetExternalWrenches & linkExtForces,
                                                                            FreeFloatingGeneralizedTorques & baseForceAndJointTorques,
                                                                            LinkInternalWrenches& linkInternalWrenches)
{
    constexpr int expected_spatial_acceleration_size = 6;
    bool ok = baseAcc.size() == expected_spatial_acceleration_size;
    if( !ok )
    {
        reportError("KinDynComputations","inverseDynamicsWithInternalJointForceTorques","Wrong size in input baseAcc");
        return false;
    }

    ok = s_ddot.size() == pimpl->m_robot_model.getNrOfDOFs();
    if( !ok )
    {
        reportError("KinDynComputations","inverseDynamicsWithInternalJointForceTorques","Wrong size in input s_ddot");
        return false;
    }


    return this->inverseDynamicsWithInternalJointForceTorques(Vector6(baseAcc),
                                                              VectorDynSize(s_ddot),
                                                              linkExtForces,
                                                              baseForceAndJointTorques,
                                                              linkInternalWrenches);
}